

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

void __thiscall VFS::CVFS::CreateDir(CVFS *this,string *Path,bool Force)

{
  element_type *this_00;
  bool bVar1;
  CVFSDir *this_01;
  CVFSException *this_02;
  long lVar2;
  ulong uVar3;
  VFSDir CurDir;
  VFSNode node;
  string local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Dirs;
  VFSDir tmp;
  __shared_ptr<VFS::CVFSNode,(__gnu_cxx::_Lock_policy)2> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  allocator<char> local_70 [32];
  string Dir;
  
  SplitPath(&Dirs,this,Path);
  std::__shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>,
             &(this->m_Root).super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>);
  lVar2 = 0;
  uVar3 = 0;
  do {
    if ((ulong)((long)Dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)Dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&Dirs);
      return;
    }
    std::__cxx11::string::string
              ((string *)&Dir,
               (string *)
               ((long)&((Dirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2));
    CVFSDir::Search((CVFSDir *)&node,
                    (string *)
                    CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   );
    if (node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if ((!Force) &&
         (uVar3 != ((long)Dirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)Dirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) goto LAB_00109a46;
      tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = (CVFSDir *)operator_new(0x80);
      CVFSDir::CVFSDir(this_01,&Dir);
      std::__shared_ptr<VFS::CVFS::CVFSDir,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<VFS::CVFS::CVFSDir,void>
                ((__shared_ptr<VFS::CVFS::CVFSDir,(__gnu_cxx::_Lock_policy)2> *)&local_d0,this_01);
      std::__shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2> *)&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
      this_00 = CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<VFS::CVFSNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<VFS::CVFS::CVFSDir,void>
                (local_80,&tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>);
      CVFSDir::AppendChild(this_00,(VFSNode *)local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      std::__shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>,
                 &tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tmp.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    else {
      bVar1 = CVFSNode::IsDir(node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
      if (!bVar1) {
LAB_00109a46:
        this_02 = (CVFSException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"Can\'t create directory",local_70);
        CVFSException::CVFSException(this_02,&local_d0,CANT_CREATE_DIR);
        __cxa_throw(this_02,&CVFSException::typeinfo,CVFSException::~CVFSException);
      }
      std::static_pointer_cast<VFS::CVFS::CVFSDir,VFS::CVFSNode>
                ((shared_ptr<VFS::CVFSNode> *)&local_d0);
      std::__shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&CurDir.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2> *)&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&Dir);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x20;
  } while( true );
}

Assistant:

void CreateDir(const std::string &Path, bool Force = false)
            {
                auto Dirs = SplitPath(Path);
                auto CurDir = m_Root;

                for (size_t i = 0; i < Dirs.size(); i++)
                {
                    std::string Dir = Dirs[i];

                    auto node = CurDir->Search(Dir);

                    //Creates the directory either if Force is true or we are at the end of the path.
                    if(!node && (Force || (i == Dirs.size() - 1)))
                    {
                        VFSDir tmp;
                        try
                        {
                            tmp = VFSDir(new CVFSDir(Dir));
                            CurDir->AppendChild(tmp);
                        }
                        catch(const std::bad_alloc &e)
                        {
                            throw CVFSException("Can't create directory. Out of mem. bad_alloc: " + std::string(e.what()), VFSError::OUT_OF_MEM);
                        }
                        
                        CurDir = tmp;
                    }
                    else if(!node || !node->IsDir())
                        throw CVFSException("Can't create directory", VFSError::CANT_CREATE_DIR);
                    else
                        CurDir = std::static_pointer_cast<CVFSDir>(node);
                }               
            }